

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall
Imath_3_1::Matrix33<double>::Matrix33
          (Matrix33<double> *this,double a,double b,double c,double d,double e,double f,double g,
          double h,double i)

{
  double h_local;
  double g_local;
  double f_local;
  double e_local;
  double d_local;
  double c_local;
  double b_local;
  double a_local;
  Matrix33<double> *this_local;
  
  this->x[0][0] = a;
  this->x[0][1] = b;
  this->x[0][2] = c;
  this->x[1][0] = d;
  this->x[1][1] = e;
  this->x[1][2] = f;
  this->x[2][0] = g;
  this->x[2][1] = h;
  this->x[2][2] = i;
  return;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline Matrix33<T>::Matrix33 (T a, T b, T c, T d, T e, T f, T g, T h, T i) IMATH_NOEXCEPT
{
    x[0][0] = a;
    x[0][1] = b;
    x[0][2] = c;
    x[1][0] = d;
    x[1][1] = e;
    x[1][2] = f;
    x[2][0] = g;
    x[2][1] = h;
    x[2][2] = i;
}